

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O2

cmMakefile * __thiscall
cmakels::cmake_query::cmake_query::get_makefile(cmake_query *this,string *uri)

{
  int iVar1;
  cmMakefile *pcVar2;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> mfs;
  string filename;
  _Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_88;
  string local_70;
  string local_50 [32];
  
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&local_88,
             &((this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->GlobalGenerator->Makefiles);
  support::uri_to_filename(&local_70,uri);
  std::__cxx11::string::string(local_50,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  do {
    if (local_88._M_impl.super__Vector_impl_data._M_start ==
        local_88._M_impl.super__Vector_impl_data._M_finish) {
      pcVar2 = (cmMakefile *)0x0;
      break;
    }
    pcVar2 = *local_88._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&local_70,
               (string *)
               (pcVar2->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = std::__cxx11::string::compare((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_88._M_impl.super__Vector_impl_data._M_start =
         local_88._M_impl.super__Vector_impl_data._M_start + 1;
  } while (iVar1 != 0);
  std::__cxx11::string::~string(local_50);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base(&local_88);
  return pcVar2;
}

Assistant:

cmMakefile *cmake_query::get_makefile(std::string const &uri) {
  auto mfs = my_cmake->GetGlobalGenerator()->GetMakefiles();
  auto filename = normalize_filename(support::uri_to_filename(uri));
  for (auto mf : mfs) {
    if (normalize_filename(mf->GetListFiles()[0]).compare(filename) == 0) {
      return mf;
    }
  }
  return nullptr;
}